

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O1

Data2D<int> * __thiscall
TasGrid::GridLocalPolynomial::buildUpdateMap<(TasGrid::RuleLocal::erule)3>
          (Data2D<int> *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,double *scale_correction)

{
  MultiIndexSet *mset;
  size_t sVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  uint uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  pointer pdVar9;
  double *pdVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  double *pdVar14;
  pointer pdVar15;
  size_t sVar16;
  long lVar17;
  pointer pdVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  double dVar23;
  Data2D<double> vals;
  vector<double,_std::allocator<double>_> norm;
  vector<int,_std::allocator<int>_> levels;
  vector<int,_std::allocator<int>_> global_to_pnts;
  Data2D<int> dagUp;
  SplitDirections split;
  int local_198;
  double *local_180;
  allocator_type local_161;
  pointer local_160;
  double *local_158;
  ulong local_150;
  ulong local_148;
  pointer local_140;
  ulong local_138;
  long local_130;
  vector<double,_std::allocator<double>_> local_128;
  pointer local_110;
  pointer local_108;
  ulong local_100;
  vector<double,_std::allocator<double>_> local_f8;
  vector<int,_std::allocator<int>_> local_e0;
  vector<int,_std::allocator<int>_> local_c8;
  Data2D<int> local_b0;
  SplitDirections local_88;
  long local_58;
  pointer local_50;
  long local_48;
  long local_40;
  size_t local_38;
  
  pdVar18 = (pointer)(long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  sVar16 = (size_t)(this->super_BaseCanonicalGrid).num_dimensions;
  local_b0.stride = CONCAT44(local_b0.stride._4_4_,-(uint)(tolerance == 0.0)) & 0xffffffff00000001;
  local_158 = scale_correction;
  ::std::vector<int,_std::allocator<int>_>::vector
            (&local_88.job_directions,sVar16 * (long)pdVar18,(value_type_conflict3 *)&local_b0,
             (allocator_type *)&local_138);
  pdVar10 = (double *)
            local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar6 = local_158;
  __return_storage_ptr__->stride = sVar16;
  __return_storage_ptr__->num_strips = (size_t)pdVar18;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if ((tolerance != 0.0) || (NAN(tolerance))) {
    local_160 = pdVar18;
    getNormalization(&local_f8,this);
    pdVar18 = local_160;
    uVar20 = 1;
    if (output == -1) {
      uVar20 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_150 = (ulong)(int)uVar20;
    local_140 = (pointer)0x0;
    local_180 = (double *)0x0;
    if (pdVar6 == (double *)0x0) {
      local_b0.stride = 0x3ff0000000000000;
      ::std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_88,local_150 * (long)local_160,
                 (value_type_conflict2 *)&local_b0,(allocator_type *)&local_138);
      local_140 = local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
      local_180 = (double *)
                  local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pdVar6 = (double *)
               local_88.job_directions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    local_158 = pdVar6;
    if (criteria < refine_direction_selective) {
      if (0 < (int)pdVar18) {
        sVar1 = (this->surpluses).stride;
        pdVar9 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar18 = (pointer)0x0;
        pdVar14 = pdVar6;
        pdVar15 = pdVar9;
        do {
          if (output == -1) {
            lVar13 = (long)(this->super_BaseCanonicalGrid).num_outputs;
            if (0 < lVar13) {
              bVar11 = true;
              lVar8 = 0;
              do {
                if (bVar11) {
                  bVar11 = (ABS(pdVar15[lVar8]) * pdVar14[lVar8]) /
                           local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar8] <= tolerance;
                }
                else {
                  bVar11 = false;
                }
                lVar8 = lVar8 + 1;
              } while (lVar13 != lVar8);
              goto LAB_001a3c37;
            }
          }
          else {
            bVar11 = (ABS(pdVar9[sVar1 * (long)pdVar18 + (long)output]) *
                     pdVar6[(long)pdVar18 * local_150]) /
                     local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[output] <= tolerance;
LAB_001a3c37:
            if ((!bVar11) &&
               (lVar13 = (long)(this->super_BaseCanonicalGrid).num_dimensions, 0 < lVar13)) {
              lVar8 = 0;
              do {
                *(undefined4 *)((long)pdVar10 + lVar8) = 1;
                lVar8 = lVar8 + 4;
              } while (lVar13 * 4 != lVar8);
            }
          }
          pdVar18 = (pointer)((long)pdVar18 + 1);
          pdVar15 = pdVar15 + sVar1;
          pdVar14 = pdVar14 + local_150;
          pdVar10 = (double *)((long)pdVar10 + sVar16 * 4);
        } while (pdVar18 != local_160);
      }
    }
    else {
      mset = &(this->super_BaseCanonicalGrid).points;
      HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>(&local_b0,mset);
      HierarchyManipulations::SplitDirections::SplitDirections(&local_88,mset);
      iVar4 = HierarchyManipulations::SplitDirections::getMaxNumPoints(&local_88);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_c8,(size_type)pdVar18,(allocator_type *)&local_138);
      ::std::vector<int,_std::allocator<int>_>::vector
                (&local_e0,(long)iVar4,(allocator_type *)&local_138);
      if (0 < (int)((ulong)((long)local_88.job_pnts.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        local_40 = (long)output;
        local_38 = __return_storage_ptr__->stride;
        local_50 = (__return_storage_ptr__->vec).super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        lVar13 = 0;
        local_58 = local_40 * 8;
        do {
          lVar8 = (long)*(int *)((long)local_88.job_directions.
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start + lVar13 * 4);
          piVar2 = local_88.job_pnts.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar13].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          uVar19 = (ulong)((long)local_88.job_pnts.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[lVar13].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
          local_138 = local_150;
          uVar5 = (uint)uVar19;
          local_130 = (long)(int)uVar5;
          ::std::vector<double,_std::allocator<double>_>::vector
                    (&local_128,local_130 * local_150,&local_161);
          local_110 = piVar2;
          local_100 = uVar19;
          local_48 = lVar13;
          if (output == -1) {
            if ((int)uVar5 < 1) goto LAB_001a3f3e;
            uVar19 = 0;
            local_198 = 0;
            do {
              lVar13 = (long)(this->super_BaseCanonicalGrid).num_outputs;
              if (0 < lVar13) {
                memmove(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start + local_138 * uVar19,
                        (this->super_BaseCanonicalGrid).values.values.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                        (long)piVar2[uVar19] * (this->super_BaseCanonicalGrid).values.num_outputs,
                        lVar13 << 3);
              }
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[piVar2[uVar19]] = (int)uVar19;
              uVar21 = (this->super_BaseCanonicalGrid).points.indexes.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(long)piVar2[uVar19] *
                                 (this->super_BaseCanonicalGrid).points.num_dimensions + lVar8] + 1;
              iVar4 = 0;
              if (1 < uVar21) {
                iVar4 = 0;
                do {
                  uVar21 = (int)uVar21 >> 1;
                  iVar4 = iVar4 + 1;
                } while (1 < uVar21);
              }
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar19] = iVar4;
              if (local_198 <= iVar4) {
                local_198 = iVar4;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != (uVar5 & 0x7fffffff));
          }
          else if ((int)uVar5 < 1) {
LAB_001a3f3e:
            local_198 = 0;
          }
          else {
            sVar16 = (this->super_BaseCanonicalGrid).points.num_dimensions;
            sVar1 = (this->super_BaseCanonicalGrid).values.num_outputs;
            pdVar9 = (this->super_BaseCanonicalGrid).values.values.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar3 = (this->super_BaseCanonicalGrid).points.indexes.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            uVar19 = 0;
            local_198 = 0;
            do {
              iVar4 = piVar2[uVar19];
              local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_138 * uVar19] =
                   *(double *)((long)pdVar9 + sVar1 * (long)iVar4 * 8 + local_58);
              local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[iVar4] = (int)uVar19;
              uVar21 = piVar3[lVar8 + (long)piVar2[uVar19] * sVar16] + 1;
              iVar4 = 0;
              if (1 < uVar21) {
                iVar4 = 0;
                do {
                  uVar21 = (int)uVar21 >> 1;
                  iVar4 = iVar4 + 1;
                } while (1 < uVar21);
              }
              local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar19] = iVar4;
              if (local_198 <= iVar4) {
                local_198 = iVar4;
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != (uVar5 & 0x7fffffff));
          }
          uVar5 = (uint)local_100;
          if (0 < local_198) {
            local_108 = (pointer)(ulong)(uVar5 & 0x7fffffff);
            local_148 = 1;
            do {
              if (0 < (int)local_100) {
                lVar13 = 0;
                pdVar9 = (pointer)0x0;
                do {
                  pdVar15 = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)pdVar9] == (int)local_148) {
                    iVar4 = (this->super_BaseCanonicalGrid).points.indexes.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [(this->super_BaseCanonicalGrid).points.num_dimensions *
                             (long)local_110[(long)pdVar9] + lVar8];
                    uVar5 = iVar4 + 1;
                    dVar23 = 1.0;
                    if (1 < uVar5) {
                      iVar12 = 1;
                      do {
                        uVar5 = (int)uVar5 >> 1;
                        iVar12 = iVar12 * 2;
                      } while (1 < uVar5);
                      dVar23 = (double)iVar12;
                    }
                    local_160 = (pointer)((double)(iVar4 * 2 + 3) / dVar23 + -3.0);
                    iVar4 = local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [(long)local_110[(long)pdVar9] * local_b0.stride + lVar8];
                    if (iVar4 != -1) {
                      lVar22 = local_138 * lVar13;
                      do {
                        lVar17 = (long)iVar4;
                        dVar23 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>
                                           (this->order,
                                            (this->super_BaseCanonicalGrid).points.indexes.
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start
                                            [(this->super_BaseCanonicalGrid).points.num_dimensions *
                                             lVar17 + lVar8],(double)local_160);
                        if (0 < (int)uVar20) {
                          iVar4 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar17];
                          uVar19 = 0;
                          do {
                            *(double *)((long)pdVar15 + uVar19 * 8 + lVar22) =
                                 local_128.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(long)iVar4 * local_138 + uVar19] * -dVar23 +
                                 *(double *)((long)pdVar15 + uVar19 * 8 + lVar22);
                            uVar19 = uVar19 + 1;
                          } while (uVar20 != uVar19);
                        }
                        iVar4 = local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar17 * local_b0.stride + lVar8];
                      } while (iVar4 != -1);
                    }
                  }
                  pdVar9 = (pointer)((long)pdVar9 + 1);
                  lVar13 = lVar13 + 8;
                } while (pdVar9 != local_108);
              }
              iVar4 = (int)local_148;
              local_148 = (ulong)(iVar4 + 1);
              uVar5 = (uint)local_100;
            } while (iVar4 != local_198);
          }
          if (0 < (int)uVar5) {
            sVar16 = (this->surpluses).stride;
            pdVar9 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            local_160 = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            local_148 = local_138;
            local_108 = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
            uVar19 = 0;
            pdVar15 = local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              lVar22 = (long)local_110[uVar19];
              lVar13 = sVar16 * lVar22;
              if (output == -1) {
                lVar17 = (long)(this->super_BaseCanonicalGrid).num_outputs;
                bVar11 = true;
                if (0 < lVar17) {
                  lVar7 = 0;
                  do {
                    if (bVar11 == false) {
                      bVar11 = false;
                    }
                    else {
                      dVar23 = (local_158 + lVar22 * local_150)[lVar7];
                      bVar11 = true;
                      if (tolerance <
                          (ABS(pdVar9[lVar13 + lVar7]) * dVar23) /
                          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7]) {
                        bVar11 = (dVar23 * ABS(pdVar15[lVar7])) /
                                 local_f8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar7] <= tolerance;
                      }
                    }
                    lVar7 = lVar7 + 1;
                  } while (lVar17 != lVar7);
                }
              }
              else {
                dVar23 = local_158[lVar22 * local_150];
                bVar11 = true;
                if (tolerance <
                    (ABS(pdVar9[lVar13 + local_40]) * dVar23) /
                    local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[local_40]) {
                  bVar11 = (dVar23 * ABS(local_128.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[local_138 * uVar19])) /
                           local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[local_40] <= tolerance;
                }
              }
              local_50[lVar8 + lVar22 * local_38] = (uint)(bVar11 ^ 1);
              uVar19 = uVar19 + 1;
              pdVar15 = pdVar15 + local_138;
            } while (uVar19 != (uVar5 & 0x7fffffff));
          }
          if (local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_128.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_128.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_128.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar13 = local_48 + 1;
        } while (lVar13 < (int)((ulong)((long)local_88.job_pnts.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_88.job_pnts.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      HierarchyManipulations::SplitDirections::~SplitDirections(&local_88);
      if (local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b0.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_180 != (double *)0x0) {
      operator_delete(local_180,(long)local_140 - (long)local_180);
    }
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Data2D<int> GridLocalPolynomial::buildUpdateMap(double tolerance, TypeRefinement criteria, int output, const double *scale_correction) const{
    int num_points = points.getNumIndexes();
    Data2D<int> pmap(num_dimensions, num_points,
                     std::vector<int>(Utils::size_mult(num_dimensions, num_points),
                                      (tolerance == 0.0) ? 1 : 0) // tolerance 0 means "refine everything"
                    );
    if (tolerance == 0.0) return pmap;

    std::vector<double> norm = getNormalization();

    int active_outputs = (output == -1) ? num_outputs : 1;
    Utils::Wrapper2D<double const> scale(active_outputs, scale_correction);
    std::vector<double> default_scale;
    if (scale_correction == nullptr){
        default_scale = std::vector<double>(Utils::size_mult(active_outputs, num_points), 1.0);
        scale = Utils::Wrapper2D<double const>(active_outputs, default_scale.data());
    }

    if ((criteria == refine_classic) || (criteria == refine_parents_first)){
        #pragma omp parallel for
        for(int i=0; i<num_points; i++){
            bool small = true;
            const double *s = surpluses.getStrip(i);
            const double *c = scale.getStrip(i);
            if (output == -1){
                for(int k=0; k<num_outputs; k++) small = small && ((c[k] * std::abs(s[k]) / norm[k]) <= tolerance);
            }else{
                small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance);
            }
            if (!small)
                std::fill_n(pmap.getStrip(i), num_dimensions, 1);
        }
    }else{
        // construct a series of 1D interpolants and use a refinement criteria that is a combination of the two hierarchical coefficients
        Data2D<int> dagUp = HierarchyManipulations::computeDAGup<effrule>(points);

        int max_1D_parents = RuleLocal::getMaxNumParents<effrule>();

        HierarchyManipulations::SplitDirections split(points);

        #pragma omp parallel
        {
            int max_nump = split.getMaxNumPoints();
            std::vector<int> global_to_pnts(num_points);
            std::vector<int> levels(max_nump);

            std::vector<int> monkey_count;
            std::vector<int> monkey_tail;
            std::vector<bool> used;
            if (max_1D_parents > 1) {
                monkey_count.resize(top_level + 1);
                monkey_tail.resize(top_level + 1);
                used.resize(max_nump, false);
            }

            #pragma omp for
            for(int j=0; j<split.getNumJobs(); j++){ // split.getNumJobs() gives the number of 1D interpolants to construct
                int d = split.getJobDirection(j);
                int nump = split.getJobNumPoints(j);
                const int *pnts = split.getJobPoints(j);

                int max_level = 0;

                Data2D<double> vals(active_outputs, nump);

                if (output == -1) {
                    for(int i=0; i<nump; i++){
                        std::copy_n(values.getValues(pnts[i]), num_outputs, vals.getStrip(i));
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                } else {
                    for(int i=0; i<nump; i++){
                        vals.getStrip(i)[0] = values.getValues(pnts[i])[output];
                        global_to_pnts[pnts[i]] = i;
                        levels[i] = RuleLocal::getLevel<effrule>(points.getIndex(pnts[i])[d]);
                        if (max_level < levels[i]) max_level = levels[i];
                    }
                }

                if (max_1D_parents == 1) {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int branch = dagUp.getStrip(pnts[i])[d];
                                while(branch != -1) {
                                    const int *branch_point = points.getIndex(branch);
                                    double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                    const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                    for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];
                                    branch = dagUp.getStrip(branch)[d];
                                }
                            }
                        }
                    }
                } else {
                    for(int l=1; l<=max_level; l++){
                        for(int i=0; i<nump; i++){
                            if (levels[i] == l){
                                double x = RuleLocal::getNode<effrule>(points.getIndex(pnts[i])[d]);
                                double *valsi = vals.getStrip(i);

                                int current = 0;
                                monkey_count[0] = d * max_1D_parents;
                                monkey_tail[0] = pnts[i]; // uses the global indexes
                                std::fill_n(used.begin(), nump, false);

                                while(monkey_count[0] < (d+1) * max_1D_parents){
                                    if (monkey_count[current] < (d+1) * max_1D_parents){
                                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                                        if ((branch == -1) || (used[global_to_pnts[branch]])){
                                            monkey_count[current]++;
                                        }else{
                                            const int *branch_point = points.getIndex(branch);
                                            double basis_value = RuleLocal::evalRaw<effrule>(order, branch_point[d], x);
                                            const double *branch_vals = vals.getStrip(global_to_pnts[branch]);
                                            for(int k=0; k<active_outputs; k++) valsi[k] -= basis_value * branch_vals[k];

                                            used[global_to_pnts[branch]] = true;
                                            monkey_count[++current] = d * max_1D_parents;
                                            monkey_tail[current] = branch;
                                        }
                                    }else{
                                        monkey_count[--current]++;
                                    }
                                }
                            }
                        }
                    }
                }

                // at this point, vals contains the one directional surpluses
                for(int i=0; i<nump; i++){
                    const double *s = surpluses.getStrip(pnts[i]);
                    const double *c = scale.getStrip(pnts[i]);
                    const double *v = vals.getStrip(i);
                    bool small = true;
                    if (output == -1){
                        for(int k=0; k<num_outputs; k++){
                            small = small && (((c[k] * std::abs(s[k]) / norm[k]) <= tolerance) || ((c[k] * std::abs(v[k]) / norm[k]) <= tolerance));
                        }
                    }else{
                        small = ((c[0] * std::abs(s[output]) / norm[output]) <= tolerance) || ((c[0] * std::abs(v[0]) / norm[output]) <= tolerance);
                    }
                    pmap.getStrip(pnts[i])[d] = (small) ? 0 : 1;;
                }
            }
        }
    }
    return pmap;
}